

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenObjectHeader(SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  byte bVar2;
  char *__s;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  GenComment(this,&(struct_def->super_Definition).doc_comment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"SHORT_STRUCTNAME",&local_1ea);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_1c8,&this->namer_,struct_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_1e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"STRUCTNAME",&local_1ea);
  IdlNamer::NamespacedType_abi_cxx11_(&local_1c8,&this->namer_,&struct_def->super_Definition);
  CodeWriter::SetValue(this_00,&local_1e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"OBJECTTYPE",&local_1ea);
  __s = "Table";
  if (struct_def->fixed != false) {
    __s = "Struct";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,__s,&local_1e9);
  CodeWriter::SetValue(this_00,&local_1e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"MUTABLE",&local_1ea);
  if (struct_def->fixed == true) {
    Mutable_abi_cxx11_(&local_1c8,this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1e9);
  }
  CodeWriter::SetValue(this_00,&local_1e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "{{ACCESS_TYPE}} struct {{STRUCTNAME}}{{MUTABLE}}: FlatBufferObject\\",
             (allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar2 = struct_def->fixed;
  if ((bool)bVar2 == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,", Verifiable\\",(allocator<char> *)&local_1e8);
    CodeWriter::operator+=(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    bVar2 = struct_def->fixed;
  }
  if (((bVar2 & 1) == 0) &&
     ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,", ObjectAPIPacker\\",(allocator<char> *)&local_1e8);
    CodeWriter::operator+=(this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8," {\n",(allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  ValidateFunc_abi_cxx11_(&local_48,this);
  CodeWriter::operator+=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "{{ACCESS_TYPE}} var __buffer: ByteBuffer! { return {{ACCESS}}.bb }",
             (allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"private var {{ACCESS}}: {{OBJECTTYPE}}\n",
             (allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if (struct_def->fixed == false) {
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"FILENAME",(allocator<char> *)&local_1c8);
      CodeWriter::SetValue
                (this_00,&local_1e8,&((this->super_BaseGenerator).parser_)->file_identifier_);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"{{ACCESS_TYPE}} static var id: String { \"{{FILENAME}}\" } ",
                 (allocator<char> *)&local_1e8);
      CodeWriter::operator+=(this_00,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,
                 "{{ACCESS_TYPE}} static func finish(_ fbb: inout FlatBufferBuilder, end: Offset, prefix: Bool = false) { fbb.finish(offset: end, fileId: {{STRUCTNAME}}.id, addPrefix: prefix) }"
                 ,(allocator<char> *)&local_1e8);
      CodeWriter::operator+=(this_00,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"private init(_ t: Table) { {{ACCESS}} = t }",
               (allocator<char> *)&local_1e8);
    CodeWriter::operator+=(this_00,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) { {{ACCESS}} = {{OBJECTTYPE}}(bb: bb, position: o) }"
             ,(allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"",(allocator<char> *)&local_1e8);
  CodeWriter::operator+=(this_00,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void GenObjectHeader(const StructDef &struct_def) {
    GenComment(struct_def.doc_comment);

    code_.SetValue("SHORT_STRUCTNAME", namer_.Type(struct_def));
    code_.SetValue("STRUCTNAME", namer_.NamespacedType(struct_def));
    code_.SetValue("OBJECTTYPE", struct_def.fixed ? "Struct" : "Table");
    code_.SetValue("MUTABLE", struct_def.fixed ? Mutable() : "");
    code_ +=
        "{{ACCESS_TYPE}} struct {{STRUCTNAME}}{{MUTABLE}}: FlatBufferObject\\";
    if (!struct_def.fixed) code_ += ", Verifiable\\";
    if (!struct_def.fixed && parser_.opts.generate_object_based_api)
      code_ += ", ObjectAPIPacker\\";
    code_ += " {\n";
    Indent();
    code_ += ValidateFunc();
    code_ +=
        "{{ACCESS_TYPE}} var __buffer: ByteBuffer! { return {{ACCESS}}.bb }";
    code_ += "private var {{ACCESS}}: {{OBJECTTYPE}}\n";
    if (!struct_def.fixed) {
      if (parser_.file_identifier_.length()) {
        code_.SetValue("FILENAME", parser_.file_identifier_);
        code_ += "{{ACCESS_TYPE}} static var id: String { \"{{FILENAME}}\" } ";
        code_ +=
            "{{ACCESS_TYPE}} static func finish(_ fbb: inout "
            "FlatBufferBuilder, end: "
            "Offset, prefix: Bool = false) { fbb.finish(offset: end, "
            "fileId: "
            "{{STRUCTNAME}}.id, addPrefix: prefix) }";
      }
      code_ += "private init(_ t: Table) { {{ACCESS}} = t }";
    }
    code_ +=
        "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) { {{ACCESS}} = "
        "{{OBJECTTYPE}}(bb: "
        "bb, position: o) }";
    code_ += "";
  }